

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingDuration.cpp
# Opt level: O2

int main(void)

{
  Session *pSVar1;
  atomic<unsigned_long> aVar2;
  SessionWriter *pSVar3;
  __atomic_base<unsigned_long> _Var4;
  nanoseconds nVar5;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_00;
  basic_ostream<char,_std::char_traits<char>_> *out;
  duration<long,_std::ratio<1L,_1000L>_> *in_R9;
  allocator local_255;
  allocator local_254;
  allocator local_253;
  allocator local_252;
  allocator local_251;
  duration<long,_std::ratio<1L,_1000000000L>_> local_250;
  duration<long,_std::ratio<1L,_1000000L>_> local_248;
  duration<long,_std::ratio<1L,_1000000L>_> local_240;
  cx_string<154UL> local_238;
  undefined1 local_198 [48];
  string local_168 [32];
  string local_148 [32];
  uint64_t local_128;
  string local_120 [32];
  string local_100 [32];
  undefined1 local_e0 [48];
  string local_b0 [32];
  string local_90 [32];
  uint64_t local_70;
  string local_68 [32];
  string local_48 [32];
  
  pSVar3 = binlog::default_thread_local_writer();
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_e0._0_8_ = 0;
      local_e0._8_2_ = info;
      std::__cxx11::string::string((string *)(local_e0 + 0x10),"main",&local_251);
      std::__cxx11::string::string(local_b0,"main",&local_252);
      std::__cxx11::string::string
                (local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingDuration.cpp"
                 ,&local_253);
      local_70 = 0xf;
      std::__cxx11::string::string(local_68,"{} {} {}",&local_254);
      local_248.__r = 1;
      local_250.__r = 2;
      local_240.__r = 3;
      binlog::detail::
      concatenated_tags<char_const(&)[9],std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,std::chrono::duration<long,std::ratio<1l,1000l>>>
                ((cx_string<140UL> *)&local_238,(detail *)"{} {} {}",(char (*) [9])&local_248,
                 &local_250,&local_240,in_R9);
      std::__cxx11::string::string(local_48,local_238._data,&local_255);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_e0);
      binlog::EventSource::~EventSource((EventSource *)local_e0);
      LOCK();
      UNLOCK();
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    local_238._data[0] = '\x01';
    local_238._data[1] = '\0';
    local_238._data[2] = '\0';
    local_238._data[3] = '\0';
    local_238._data[4] = '\0';
    local_238._data[5] = '\0';
    local_238._data[6] = '\0';
    local_238._data[7] = '\0';
    local_248.__r = 2;
    in_R9 = (duration<long,_std::ratio<1L,_1000L>_> *)&local_250;
    local_250.__r = 3;
    binlog::SessionWriter::
    addEvent<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>,std::chrono::duration<long,std::ratio<1l,1000l>>>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)&local_238,&local_248,in_R9);
  }
  pSVar3 = binlog::default_thread_local_writer();
  out = extraout_RDX;
  if ((pSVar3->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      pSVar1 = pSVar3->_session;
      local_198._0_8_ = 0;
      local_198._8_2_ = info;
      std::__cxx11::string::string((string *)(local_198 + 0x10),"main",&local_251);
      std::__cxx11::string::string(local_168,"main",&local_252);
      std::__cxx11::string::string
                (local_148,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingDuration.cpp"
                 ,&local_253);
      local_128 = 0x11;
      std::__cxx11::string::string(local_120,"{} {} {}",&local_254);
      local_248.__r = 4;
      local_250.__r = 5;
      local_240.__r = 6;
      binlog::detail::
      concatenated_tags<char_const(&)[9],std::chrono::duration<long,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<60l,1l>>,std::chrono::duration<long,std::ratio<3600l,1l>>>
                (&local_238,(detail *)"{} {} {}",(char (*) [9])&local_248,
                 (duration<long,_std::ratio<1L,_1L>_> *)&local_250,
                 (duration<long,_std::ratio<60L,_1L>_> *)&local_240,
                 (duration<long,_std::ratio<3600L,_1L>_> *)in_R9);
      std::__cxx11::string::string(local_100,local_238._data,&local_255);
      _Var4._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_198);
      binlog::EventSource::~EventSource((EventSource *)local_198);
      LOCK();
      UNLOCK();
      main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var4._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
    pSVar3 = binlog::default_thread_local_writer();
    nVar5 = binlog::clockSinceEpoch();
    local_238._data[0] = '\x04';
    local_238._data[1] = '\0';
    local_238._data[2] = '\0';
    local_238._data[3] = '\0';
    local_238._data[4] = '\0';
    local_238._data[5] = '\0';
    local_238._data[6] = '\0';
    local_238._data[7] = '\0';
    local_248.__r = 5;
    local_250.__r = 6;
    binlog::SessionWriter::
    addEvent<std::chrono::duration<long,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<60l,1l>>,std::chrono::duration<long,std::ratio<3600l,1l>>>
              (pSVar3,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar5.__r,
               (duration<long,_std::ratio<1L,_1L>_> *)&local_238,
               (duration<long,_std::ratio<60L,_1L>_> *)&local_248,
               (duration<long,_std::ratio<3600L,_1L>_> *)&local_250);
    out = extraout_RDX_00;
  }
  binlog::consume<std::ostream>((ConsumeResult *)&local_238,(binlog *)&std::cout,out);
  return 0;
}

Assistant:

int main()
{

  //[duration

  BINLOG_INFO("{} {} {}", std::chrono::nanoseconds{1}, std::chrono::microseconds{2}, std::chrono::milliseconds{3});
  // Outputs: 1ns 2us 3ms
  BINLOG_INFO("{} {} {}", std::chrono::seconds{4}, std::chrono::minutes{5}, std::chrono::hours{6});
  // Outputs: 4s 5m 6h
  //]


  binlog::consume(std::cout);
  return 0;
}